

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::iterate(FunctionalTest3_4 *this)

{
  GLuint program_id;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  NotSupportedError *this_00;
  socklen_t __len;
  sockaddr *__addr;
  char *description;
  qpTestResult testResult;
  byte bVar5;
  long lVar6;
  buffer transform_feedback_buffer;
  vertexArray vao;
  program program;
  
  if ((iterate()::inverse_order_negate_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::inverse_order_negate_data), iVar3 != 0)) {
    iterate::inverse_order_negate_data[0] = _DAT_016a9690;
    iterate::inverse_order_negate_data[1] = _DAT_016a96a0;
    iterate::inverse_order_negate_data[2] = _DAT_016a96a0;
    iterate::inverse_order_negate_data[3] = _DAT_016a9690;
    iterate::inverse_order_negate_data[4] = _DAT_016a9690;
    __cxa_guard_release(&iterate()::inverse_order_negate_data);
  }
  if ((iterate()::inverse_order_inverse_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::inverse_order_inverse_data), iVar3 != 0)) {
    iterate::inverse_order_inverse_data[0] = _DAT_016a9690;
    iterate::inverse_order_inverse_data[1] = _DAT_016a96a0;
    iterate::inverse_order_inverse_data[2] = _DAT_016a96b0;
    iterate::inverse_order_inverse_data[3] = _DAT_016a96c0;
    iterate::inverse_order_inverse_data[4] = _DAT_016a96c0;
    __cxa_guard_release(&iterate()::inverse_order_inverse_data);
  }
  if ((iterate()::inverse_order_square_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::inverse_order_square_data), iVar3 != 0)) {
    iterate::inverse_order_square_data[0] = _DAT_016a9690;
    iterate::inverse_order_square_data[1] = _DAT_016a96a0;
    iterate::inverse_order_square_data[2] = _DAT_016a96d0;
    iterate::inverse_order_square_data[3] = _DAT_016a96d0;
    iterate::inverse_order_square_data[4] = _DAT_016a96d0;
    __cxa_guard_release(&iterate()::inverse_order_square_data);
  }
  if ((iterate()::negate_inverse_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::negate_inverse_data), iVar3 != 0)) {
    iterate::negate_inverse_data[0] = _DAT_016a9690;
    iterate::negate_inverse_data[1] = _DAT_016a96a0;
    iterate::negate_inverse_data[2] = _DAT_016a96b0;
    iterate::negate_inverse_data[3] = _DAT_016a96c0;
    iterate::negate_inverse_data[4] = _DAT_016a96c0;
    __cxa_guard_release(&iterate()::negate_inverse_data);
  }
  if ((iterate()::negate_square_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::negate_square_data), iVar3 != 0)) {
    iterate::negate_square_data[0] = _DAT_016a9690;
    iterate::negate_square_data[1] = _DAT_016a96a0;
    iterate::negate_square_data[2] = _DAT_016a96d0;
    iterate::negate_square_data[3] = _DAT_016a96d0;
    iterate::negate_square_data[4] = _DAT_016a96e0;
    __cxa_guard_release(&iterate()::negate_square_data);
  }
  if ((iterate()::inverse_square_data == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::inverse_square_data), iVar3 != 0)) {
    iterate::inverse_square_data[0] = _DAT_016a9690;
    iterate::inverse_square_data[1] = _DAT_016a96b0;
    iterate::inverse_square_data[2] = _DAT_016a96d0;
    iterate::inverse_square_data[3] = _DAT_016a96f0;
    iterate::inverse_square_data[4] = _DAT_016a96f0;
    __cxa_guard_release(&iterate()::inverse_square_data);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)&transform_feedback_buffer);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&program);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this->m_n_active_subroutine_uniforms = 2;
  this->m_n_active_subroutine_uniform_locations = 2;
  this->m_n_active_subroutines = 4;
  this->m_n_active_subroutine_uniform_name_length = 0;
  this->m_n_active_subroutine_name_length = 0;
  this->m_n_active_subroutine_uniform_size = 1;
  transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  transform_feedback_buffer.m_id = 0;
  vao.m_id = 0;
  iVar3 = 0;
  vao.m_context = transform_feedback_buffer.m_context;
  program.m_context = transform_feedback_buffer.m_context;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 8) {
    sVar4 = strlen(*(char **)((long)iterate::subroutine_uniform_names + lVar6));
    iVar2 = (int)sVar4;
    if (iVar3 < iVar2) {
      this->m_n_active_subroutine_uniform_name_length = iVar2;
      iVar3 = iVar2;
    }
  }
  iVar3 = 0;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    sVar4 = strlen(*(char **)((long)iterate::subroutine_names + lVar6));
    iVar2 = (int)sVar4;
    if (iVar3 < iVar2) {
      this->m_n_active_subroutine_name_length = iVar2;
      iVar3 = iVar2;
    }
  }
  iVar3 = 0;
  __len = 0;
  Utils::program::build
            (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Sub routine type declaration\nsubroutine vec4 routine_type(in vec4 iparam);\n\n// Sub routine definitions\nsubroutine(routine_type) vec4 inverse_order(in vec4 iparam)\n{\n    return iparam.wzyx;\n}\n\nsubroutine(routine_type) vec4 negate(in vec4 iparam)\n{\n    return -iparam;\n}\n\nsubroutine(routine_type) vec4 inverse(in vec4 iparam)\n{\n    return 1 / iparam;\n}\n\nsubroutine(routine_type) vec4 square(in vec4 iparam)\n{\n    return iparam * iparam;\n}\n\n// Sub routine uniforms\nsubroutine uniform routine_type first_routine;\nsubroutine uniform routine_type second_routine;\n\n// Input data\nuniform vec4 input_data;\n\n// Output\nout vec4 out_input_data;\nout vec4 out_result_from_first_routine;\nout vec4 out_result_from_second_routine;\nout vec4 out_result_from_combined_routines;\nout vec4 out_result_from_routines_combined_in_reveresed_order;\n\nvoid main()\n{\n    out_input_data                                       = input_data;\n    out_result_from_first_routine                        = first_routine(input_data);\n    out_result_from_second_routine                       = second_routine(input_data);\n    out_result_from_combined_routines                    = second_routine(first_routine(input_data));\n    out_result_from_routines_combined_in_reveresed_order = first_routine(second_routine(input_data));\n}\n\n"
             ,iterate::varying_names,5,false);
  Utils::vertexArray::generate(&vao);
  Utils::vertexArray::bind(&vao,iVar3,__addr,__len);
  Utils::buffer::generate(&transform_feedback_buffer);
  Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x50,(GLvoid *)0x0,0x88ea);
  Utils::buffer::bindRange(&transform_feedback_buffer,0x8c8e,0,0,0x50);
  Utils::program::use(&program);
  program_id = program.m_program_object_id;
  bVar1 = inspectProgramStageiv(this,program.m_program_object_id);
  if ((((bVar1) &&
       (bVar1 = inspectActiveSubroutineUniformiv(this,program_id,iterate::subroutine_uniform_names),
       bVar1)) &&
      (bVar1 = inspectActiveSubroutineUniformName(this,program_id,iterate::subroutine_uniform_names)
      , bVar1)) &&
     (bVar1 = inspectActiveSubroutineName(this,program_id,iterate::subroutine_names), bVar1)) {
    bVar1 = inspectSubroutineBinding
                      (this,program_id,iterate::subroutine_names,iterate::subroutine_uniform_names,
                       false);
    bVar5 = 1;
    if (!bVar1) goto LAB_00a13649;
  }
  else {
LAB_00a13649:
    bVar5 = 0;
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_program_interface_query");
  if ((bVar1) &&
     (((bVar1 = inspectProgramInterfaceiv(this,program_id), !bVar1 ||
       (bVar1 = inspectProgramResourceiv
                          (this,program_id,iterate::subroutine_names,
                           iterate::subroutine_uniform_names), !bVar1)) ||
      (bVar1 = inspectSubroutineBinding
                         (this,program_id,iterate::subroutine_names,
                          iterate::subroutine_uniform_names,true), !bVar1)))) {
    bVar5 = 0;
  }
  bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[1],
                   iterate::subroutine_uniform_names,iterate::inverse_order_negate_data,false);
  if (((!bVar1) ||
      (bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[2],
                        iterate::subroutine_uniform_names,iterate::inverse_order_inverse_data,false)
      , !bVar1)) ||
     ((bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[3],
                        iterate::subroutine_uniform_names,iterate::inverse_order_square_data,false),
      !bVar1 || (((bVar1 = testDraw(this,program_id,iterate::subroutine_names[1],
                                    iterate::subroutine_names[2],iterate::subroutine_uniform_names,
                                    iterate::negate_inverse_data,false), !bVar1 ||
                  (bVar1 = testDraw(this,program_id,iterate::subroutine_names[1],
                                    iterate::subroutine_names[3],iterate::subroutine_uniform_names,
                                    iterate::negate_square_data,false), !bVar1)) ||
                 (bVar1 = testDraw(this,program_id,iterate::subroutine_names[2],
                                   iterate::subroutine_names[3],iterate::subroutine_uniform_names,
                                   iterate::inverse_square_data,false), !bVar1)))))) {
    bVar5 = 0;
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_program_interface_query");
  if (bVar1) {
    bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[1],
                     iterate::subroutine_uniform_names,iterate::inverse_order_negate_data,true);
    if (((bVar1) &&
        (bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[2],
                          iterate::subroutine_uniform_names,iterate::inverse_order_inverse_data,true
                         ), bVar1)) &&
       ((bVar1 = testDraw(this,program_id,iterate::subroutine_names[0],iterate::subroutine_names[3],
                          iterate::subroutine_uniform_names,iterate::inverse_order_square_data,true)
        , bVar1 &&
        ((bVar1 = testDraw(this,program_id,iterate::subroutine_names[1],iterate::subroutine_names[2]
                           ,iterate::subroutine_uniform_names,iterate::negate_inverse_data,true),
         bVar1 && (bVar1 = testDraw(this,program_id,iterate::subroutine_names[1],
                                    iterate::subroutine_names[3],iterate::subroutine_uniform_names,
                                    iterate::negate_square_data,true), bVar1)))))) {
      bVar1 = testDraw(this,program_id,iterate::subroutine_names[2],iterate::subroutine_names[3],
                       iterate::subroutine_uniform_names,iterate::inverse_square_data,true);
      bVar5 = bVar5 & bVar1;
      goto joined_r0x00a13932;
    }
  }
  else {
joined_r0x00a13932:
    if (bVar5 != 0) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00a1393d;
    }
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00a1393d:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::buffer::~buffer(&transform_feedback_buffer);
  Utils::program::~program(&program);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest3_4::iterate()
{
	static const glw::GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Sub routine type declaration\n"
		"subroutine vec4 routine_type(in vec4 iparam);\n"
		"\n"
		"// Sub routine definitions\n"
		"subroutine(routine_type) vec4 inverse_order(in vec4 iparam)\n"
		"{\n"
		"    return iparam.wzyx;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 negate(in vec4 iparam)\n"
		"{\n"
		"    return -iparam;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 inverse(in vec4 iparam)\n"
		"{\n"
		"    return 1 / iparam;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 square(in vec4 iparam)\n"
		"{\n"
		"    return iparam * iparam;\n"
		"}\n"
		"\n"
		"// Sub routine uniforms\n"
		"subroutine uniform routine_type first_routine;\n"
		"subroutine uniform routine_type second_routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 input_data;\n"
		"\n"
		"// Output\n"
		"out vec4 out_input_data;\n"
		"out vec4 out_result_from_first_routine;\n"
		"out vec4 out_result_from_second_routine;\n"
		"out vec4 out_result_from_combined_routines;\n"
		"out vec4 out_result_from_routines_combined_in_reveresed_order;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_input_data                                       = input_data;\n"
		"    out_result_from_first_routine                        = first_routine(input_data);\n"
		"    out_result_from_second_routine                       = second_routine(input_data);\n"
		"    out_result_from_combined_routines                    = second_routine(first_routine(input_data));\n"
		"    out_result_from_routines_combined_in_reveresed_order = first_routine(second_routine(input_data));\n"
		"}\n"
		"\n";

	static const GLchar* varying_names[] = {
		"out_input_data",
		"out_result_from_first_routine",
		"out_result_from_second_routine",
		"out_result_from_combined_routines",
		"out_result_from_routines_combined_in_reveresed_order",
	};

	static const GLchar* subroutine_uniform_names[] = { "first_routine", "second_routine" };

	static const GLchar* subroutine_names[] = { "inverse_order", "negate", "inverse", "square" };

	static const GLuint n_varyings					   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varyings * sizeof(GLfloat) * 4 /* vec4 */;

	static const GLuint inverse_order_routine_index = 0;
	static const GLuint negate_routine_index		= 1;
	static const GLuint inverse_routine_index		= 2;
	static const GLuint square_routine_index		= 3;

	/* Test data */
	static const Utils::vec4<GLfloat> inverse_order_negate_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f), Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f),
		Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f), Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f),
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f),
	};

	static const Utils::vec4<GLfloat> inverse_order_inverse_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f), Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f),
		Utils::vec4<GLfloat>(-0.5f, -1.0f, 1.0f, 0.5f), Utils::vec4<GLfloat>(0.5f, 1.0f, -1.0f, -0.5f),
		Utils::vec4<GLfloat>(0.5f, 1.0f, -1.0f, -0.5f),
	};

	static const Utils::vec4<GLfloat> inverse_order_square_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f), Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f),
		Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),   Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),
		Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),
	};

	static const Utils::vec4<GLfloat> negate_inverse_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f), Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f),
		Utils::vec4<GLfloat>(-0.5f, -1.0f, 1.0f, 0.5f), Utils::vec4<GLfloat>(0.5f, 1.0f, -1.0f, -0.5f),
		Utils::vec4<GLfloat>(0.5f, 1.0f, -1.0f, -0.5f),
	};

	static const Utils::vec4<GLfloat> negate_square_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f),   Utils::vec4<GLfloat>(2.0f, 1.0f, -1.0f, -2.0f),
		Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),	 Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),
		Utils::vec4<GLfloat>(-4.0f, -1.0f, -1.0f, -4.0f),
	};

	static const Utils::vec4<GLfloat> inverse_square_data[5] = {
		Utils::vec4<GLfloat>(-2.0f, -1.0f, 1.0f, 2.0f), Utils::vec4<GLfloat>(-0.5f, -1.0f, 1.0f, 0.5f),
		Utils::vec4<GLfloat>(4.0f, 1.0f, 1.0f, 4.0f),   Utils::vec4<GLfloat>(0.25f, 1.0f, 1.0f, 0.25f),
		Utils::vec4<GLfloat>(0.25f, 1.0f, 1.0f, 0.25f),
	};

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	m_n_active_subroutine_uniforms			  = 2;
	m_n_active_subroutine_uniform_locations   = 2;
	m_n_active_subroutines					  = 4;
	m_n_active_subroutine_uniform_name_length = 0;
	m_n_active_subroutine_name_length		  = 0;
	m_n_active_subroutine_uniform_size		  = 1;

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool result = true;

	/* Calculate max name lengths for subroutines and subroutine uniforms */
	for (GLint i = 0; i < m_n_active_subroutine_uniforms; ++i)
	{
		const GLsizei length = (GLsizei)strlen(subroutine_uniform_names[i]);

		if (length > m_n_active_subroutine_uniform_name_length)
		{
			m_n_active_subroutine_uniform_name_length = length;
		}
	}

	for (GLint i = 0; i < m_n_active_subroutines; ++i)
	{
		const GLsizei length = (GLsizei)strlen(subroutine_names[i]);

		if (length > m_n_active_subroutine_name_length)
		{
			m_n_active_subroutine_name_length = length;
		}
	}

	/* Init */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, varying_names,
				  n_varyings);

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	program.use();

	/* Inspect Get* API */
	if ((false == inspectProgramStageiv(program.m_program_object_id)) ||
		(false == inspectActiveSubroutineUniformiv(program.m_program_object_id, subroutine_uniform_names)) ||
		(false == inspectActiveSubroutineUniformName(program.m_program_object_id, subroutine_uniform_names)) ||
		(false == inspectActiveSubroutineName(program.m_program_object_id, subroutine_names)) ||
		(false ==
		 inspectSubroutineBinding(program.m_program_object_id, subroutine_names, subroutine_uniform_names, false)))
	{
		result = false;
	}

	/* Inspect GetProgram* API */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_program_interface_query"))
	{
		if ((false == inspectProgramInterfaceiv(program.m_program_object_id)) ||
			(false ==
			 inspectProgramResourceiv(program.m_program_object_id, subroutine_names, subroutine_uniform_names)) ||
			(false ==
			 inspectSubroutineBinding(program.m_program_object_id, subroutine_names, subroutine_uniform_names, true)))
		{
			result = false;
		}
	}

	/* Test shader execution */
	if ((false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
						   subroutine_names[negate_routine_index], subroutine_uniform_names, inverse_order_negate_data,
						   false)) ||
		(false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
						   subroutine_names[inverse_routine_index], subroutine_uniform_names,
						   inverse_order_inverse_data, false)) ||
		(false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
						   subroutine_names[square_routine_index], subroutine_uniform_names, inverse_order_square_data,
						   false)) ||
		(false == testDraw(program.m_program_object_id, subroutine_names[negate_routine_index],
						   subroutine_names[inverse_routine_index], subroutine_uniform_names, negate_inverse_data,
						   false)) ||
		(false == testDraw(program.m_program_object_id, subroutine_names[negate_routine_index],
						   subroutine_names[square_routine_index], subroutine_uniform_names, negate_square_data,
						   false)) ||
		(false == testDraw(program.m_program_object_id, subroutine_names[inverse_routine_index],
						   subroutine_names[square_routine_index], subroutine_uniform_names, inverse_square_data,
						   false)))
	{
		result = false;
	}

	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_program_interface_query"))
	{
		if ((false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
							   subroutine_names[negate_routine_index], subroutine_uniform_names,
							   inverse_order_negate_data, true)) ||
			(false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
							   subroutine_names[inverse_routine_index], subroutine_uniform_names,
							   inverse_order_inverse_data, true)) ||
			(false == testDraw(program.m_program_object_id, subroutine_names[inverse_order_routine_index],
							   subroutine_names[square_routine_index], subroutine_uniform_names,
							   inverse_order_square_data, true)) ||
			(false == testDraw(program.m_program_object_id, subroutine_names[negate_routine_index],
							   subroutine_names[inverse_routine_index], subroutine_uniform_names, negate_inverse_data,
							   true)) ||
			(false == testDraw(program.m_program_object_id, subroutine_names[negate_routine_index],
							   subroutine_names[square_routine_index], subroutine_uniform_names, negate_square_data,
							   true)) ||
			(false == testDraw(program.m_program_object_id, subroutine_names[inverse_routine_index],
							   subroutine_names[square_routine_index], subroutine_uniform_names, inverse_square_data,
							   true)))
		{
			result = false;
		}
	}

	/* Done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}